

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

ssize_t __thiscall
gnuplotio::Gnuplot::send(Gnuplot *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  void *__buf_00;
  undefined4 in_register_00000034;
  PlotGroup local_60;
  
  PlotGroup::PlotGroup(&local_60,(PlotGroup *)CONCAT44(in_register_00000034,__fd));
  sVar1 = send(this,(int)&local_60,__buf_00,__n,__flags);
  PlotGroup::~PlotGroup(&local_60);
  return sVar1;
}

Assistant:

Gnuplot &send(const PlotGroup &plot_group) {
        return send(PlotGroup(plot_group));
    }